

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O0

error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<typename_span<unsigned_short,__1L>::element_type>_>
* __thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>const&)>
::get_span<pstore::gsl::span<unsigned_short,_1l>>
          (error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<typename_span<unsigned_short,__1L>::element_type>_>
           *__return_storage_ptr__,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>
          *this,descriptor<pstore::details::posix_descriptor_traits> *io,
          span<unsigned_short,__1L> *sp)

{
  span<unsigned_short,__1L> s;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_60;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span>
  local_50;
  anon_class_1_0_00000001 local_29;
  span<unsigned_short,__1L> *psStack_28;
  anon_class_1_0_00000001 cast;
  span<unsigned_short,__1L> *sp_local;
  descriptor<pstore::details::posix_descriptor_traits> *io_local;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *this_local;
  
  s.storage_.data_ = (pointer)io;
  s.storage_.super_extent_type<_1L>.size_ = (index_type)(sp->storage_).data_;
  psStack_28 = sp;
  local_60 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::as_writeable_bytes<unsigned_short,_1l,void>
                       ((gsl *)(sp->storage_).super_extent_type<_1L>.size_,s);
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::get_span_impl(&local_50,
                  (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                   *)this,io,(byte_span *)&local_60);
  pstore::operator>>=((error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<element_type>_>
                       *)__return_storage_ptr__,&local_50,&local_29);
  error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::span<unsigned_char,_-1L>_>_>
  ::~error_or(&local_50);
  return __return_storage_ptr__;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span (IO io, SpanType const & sp)
            -> error_or_n<IO, gsl::span<typename SpanType::element_type>> {

            auto cast = [] (IO io2, byte_span const & sp2) {
                using element_type = typename SpanType::element_type;
                using index_type = typename SpanType::index_type;
                auto const first = reinterpret_cast<element_type *> (sp2.data ());
                auto const elements =
                    std::max (sp2.size (), index_type{0}) / index_type{sizeof (element_type)};
                return error_or_n<IO, gsl::span<element_type>>{
                    in_place, io2, gsl::make_span (first, first + elements)};
            };
            return this->get_span_impl (io, as_writeable_bytes (sp)) >>= cast;
        }